

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O1

void __thiscall QPDFArgParser::getAllHelp(QPDFArgParser *this,ostringstream *msg)

{
  ostream *poVar1;
  anon_class_16_2_633b96ae show;
  anon_class_16_2_633b96ae local_28;
  
  getTopHelp(this,msg);
  local_28.this = this;
  local_28.msg = msg;
  getAllHelp::anon_class_16_2_633b96ae::operator()
            (&local_28,
             &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->help_topics);
  getAllHelp::anon_class_16_2_633b96ae::operator()
            (&local_28,
             &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->option_help);
  std::ios::widen((char)*(undefined8 *)(*(long *)msg + -0x18) + (char)msg);
  std::ostream::put((char)msg);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"====",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void
QPDFArgParser::getAllHelp(std::ostringstream& msg)
{
    getTopHelp(msg);
    auto show = [this, &msg](std::map<std::string, HelpTopic>& topics) {
        for (auto const& i: topics) {
            auto const& topic = i.first;
            msg << std::endl
                << "== " << topic << " (" << i.second.short_text << ") ==" << std::endl
                << std::endl;
            getTopicHelp(topic, i.second, msg);
        }
    };
    show(m->help_topics);
    show(m->option_help);
    msg << std::endl << "====" << std::endl;
}